

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O3

IAddress * __thiscall IRT::CFrame::GetClassFieldAddress(CFrame *this,string *varName)

{
  const_iterator cVar1;
  IAddress *pIVar2;
  
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::IAddress,_std::default_delete<const_IRT::IAddress>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::IAddress,_std::default_delete<const_IRT::IAddress>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->classFieldAddresses)._M_h,varName);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::IAddress,_std::default_delete<const_IRT::IAddress>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    pIVar2 = (IAddress *)0x0;
  }
  else {
    pIVar2 = *(IAddress **)
              ((long)cVar1.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::IAddress,_std::default_delete<const_IRT::IAddress>_>_>,_true>
                     ._M_cur + 0x28);
  }
  return pIVar2;
}

Assistant:

const IAddress *CFrame::GetClassFieldAddress(const std::string &varName) const {
    auto addressIt = classFieldAddresses.find(varName);
    const IAddress *res = nullptr;
    if (addressIt != classFieldAddresses.end()) {
        res = addressIt->second.get();
    }
    return res;
}